

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O1

void elf_addrelocnode(RelocList *rl,uint64_t offset,uint64_t addend,uint32_t symidx,uint32_t type,
                     bool be)

{
  node *n;
  node *pnVar1;
  
  n = (node *)alloc(0x18);
  pnVar1 = (node *)alloc(rl->relasize);
  (*rl->initreloc)(pnVar1,offset,addend,symidx,type,be);
  n[1].next = pnVar1;
  addtail(&rl->l,n);
  return;
}

Assistant:

void elf_addrelocnode(struct RelocList *rl,uint64_t offset,uint64_t addend,
                      uint32_t symidx,uint32_t type,bool be)
{
  struct RelocNode *rn = alloc(sizeof(struct RelocNode));
  void *elfrel = alloc(rl->relasize);

  rl->initreloc(elfrel,offset,addend,symidx,type,be);
  rn->elfreloc = elfrel;
  addtail(&rl->l,&rn->n);
}